

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covInt.h
# Opt level: O2

int Min_CoverContainsCube(Min_Man_t *p,Min_Cube_t *pCube)

{
  uint uVar1;
  Min_Cube_t **ppMVar2;
  int iVar3;
  Min_Cube_t *pCube0;
  long lVar4;
  
  uVar1 = *(uint *)&pCube->field_0x8;
  ppMVar2 = p->ppStore;
  lVar4 = 0;
  do {
    if (lVar4 == (ulong)(uVar1 >> 0x16) + 1) {
      return 0;
    }
    pCube0 = (Min_Cube_t *)(ppMVar2 + lVar4);
    while (pCube0 = pCube0->pNext, pCube0 != (Min_Cube_t *)0x0) {
      if ((pCube0 != p->pBubble) && (iVar3 = Min_CubeIsContained(pCube0,pCube), iVar3 != 0)) {
        return 1;
      }
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

static inline int Min_CoverContainsCube( Min_Man_t * p, Min_Cube_t * pCube )
{
    Min_Cube_t * pThis;
    int i;
/*
    // this cube cannot be equal to any cube
    Min_CoverForEachCube( p->ppStore[pCube->nLits], pThis )
    {
        if ( Min_CubesAreEqual( pCube, pThis ) )
        {
            Min_CubeWrite( stdout, pCube );
            assert( 0 );
        }
    }
*/
    // try to find a containing cube
    for ( i = 0; i <= (int)pCube->nLits; i++ )
    Min_CoverForEachCube( p->ppStore[i], pThis )
    {
        // skip the bubble
        if ( pThis != p->pBubble && Min_CubeIsContained( pThis, pCube ) )
            return 1;
    }
    return 0;
}